

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacReporters.cpp
# Opt level: O3

void __thiscall ApprovalTests::Mac::DiffMergeReporter::DiffMergeReporter(DiffMergeReporter *this)

{
  DiffInfo local_58;
  
  DiffPrograms::Mac::DIFF_MERGE();
  GenericDiffReporter::GenericDiffReporter(&this->super_GenericDiffReporter,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.arguments._M_dataplus._M_p != &local_58.arguments.field_2) {
    operator_delete(local_58.arguments._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.program._M_dataplus._M_p != &local_58.program.field_2) {
    operator_delete(local_58.program._M_dataplus._M_p);
  }
  (this->super_GenericDiffReporter).super_CommandReporter.super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_001b2450;
  return;
}

Assistant:

DiffMergeReporter::DiffMergeReporter()
            : GenericDiffReporter(DiffPrograms::Mac::DIFF_MERGE())
        {
        }